

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noproxy.c
# Opt level: O1

_Bool Curl_check_noproxy(char *name,char *no_proxy)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  long lVar6;
  size_t __n;
  ulong max;
  uint uVar7;
  char *second;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  _Bool _Var11;
  char *pcVar12;
  bool bVar13;
  uchar address_1 [16];
  char checkip [128];
  char hostip [128];
  ulong local_168;
  uint local_158 [4];
  uint local_148 [4];
  char local_138 [128];
  char local_b8 [136];
  
  if (name == (char *)0x0) {
    return false;
  }
  cVar1 = *name;
  if (cVar1 == '\0') {
    return false;
  }
  if (no_proxy == (char *)0x0) {
    return false;
  }
  if (*no_proxy == '\0') {
    return false;
  }
  iVar3 = strcmp("*",no_proxy);
  if (iVar3 == 0) {
    _Var11 = true;
    bVar13 = false;
    goto LAB_00149cd7;
  }
  if (cVar1 == '[') {
    pcVar5 = strchr(name,0x5d);
    if (pcVar5 == (char *)0x0) {
LAB_001499ae:
      bVar13 = false;
      iVar8 = 0;
    }
    else {
      pcVar12 = name + 1;
      local_168 = (long)pcVar5 - (long)pcVar12;
      name = pcVar12;
      if (0x7f < local_168) goto LAB_001499ae;
      name = local_b8;
      memcpy(name,pcVar12,local_168);
      local_b8[local_168] = '\0';
      iVar8 = 2;
      bVar13 = true;
    }
    if (!bVar13) {
      bVar13 = false;
      _Var11 = false;
      goto LAB_00149cd7;
    }
  }
  else {
    local_168 = strlen(name);
    iVar3 = inet_pton(2,name,local_b8);
    iVar8 = 1;
    if (iVar3 != 1) {
      local_168 = local_168 - (name[local_168 - 1] == '.');
      iVar8 = 0;
    }
  }
  _Var11 = false;
  do {
    bVar13 = true;
    if (*no_proxy == '\0') goto LAB_00149cd7;
    pcVar5 = no_proxy + -1;
    for (pcVar12 = no_proxy; (cVar1 = *pcVar12, cVar1 == '\t' || (cVar1 == ' '));
        pcVar12 = pcVar12 + 1) {
      pcVar5 = pcVar5 + 1;
    }
    sVar10 = 0xffffffffffffffff;
    lVar6 = 0;
    while ((0x2c < (ulong)(byte)pcVar12[sVar10 + 1] ||
           ((0x100100000201U >> ((ulong)(byte)pcVar12[sVar10 + 1] & 0x3f) & 1) == 0))) {
      lVar6 = lVar6 + -1;
      sVar10 = sVar10 + 1;
      pcVar5 = pcVar5 + 1;
    }
    no_proxy = pcVar12 + -lVar6;
    if (lVar6 == 0) {
LAB_00149c49:
      for (; (cVar1 = *no_proxy, cVar1 == '\t' || (cVar1 == ' ')); no_proxy = no_proxy + 1) {
        pcVar5 = pcVar5 + 1;
      }
      if (cVar1 != ',') {
        iVar3 = 3;
        goto LAB_00149c76;
      }
      do {
        pcVar12 = pcVar5 + 1;
        no_proxy = pcVar5 + 1;
        pcVar5 = no_proxy;
      } while (*pcVar12 == ',');
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      __n = -lVar6;
      if (iVar8 == 0) {
        if (pcVar12[sVar10] == '.') {
          __n = sVar10;
        }
        if (__n == 0) {
          __n = 0;
        }
        else if (cVar1 == '.') {
          pcVar12 = pcVar12 + 1;
          __n = __n - 1;
        }
        lVar6 = local_168 - __n;
        max = local_168;
        second = name;
        if (lVar6 != 0) {
          if ((local_168 < __n || lVar6 == 0) || (name[lVar6 + -1] != '.')) goto LAB_00149c49;
          max = __n;
          second = name + lVar6;
        }
        iVar3 = curl_strnequal(pcVar12,second,max);
        bVar13 = iVar3 != 0;
      }
      else {
        bVar13 = false;
        if (__n < 0x7f || lVar6 == -0x7f) {
          memcpy(local_138,pcVar12,__n);
          local_138[sVar10 + 1] = '\0';
          uVar4 = 0;
          pcVar12 = strchr(local_138,0x2f);
          if (pcVar12 != (char *)0x0) {
            uVar4 = atoi(pcVar12 + 1);
            *pcVar12 = '\0';
          }
          if (iVar8 == 2) {
            if (uVar4 == 0) {
              uVar4 = 0x80;
            }
            if (uVar4 < 0x88) {
              uVar9 = uVar4 >> 3;
              uVar7 = uVar4 & 7;
              if (uVar9 != 0x10 || uVar7 == 0) {
                iVar3 = inet_pton(10,name,local_148);
                if (((iVar3 != 1) || (iVar3 = inet_pton(10,local_138,local_158), iVar3 != 1)) ||
                   ((7 < uVar4 && (iVar3 = bcmp(local_148,local_158,(ulong)uVar9), iVar3 != 0))))
                goto LAB_00149c22;
                if ((uVar7 == 0) ||
                   ((byte)((*(byte *)((long)local_158 + (ulong)uVar9) ^
                           *(byte *)((long)local_148 + (ulong)uVar9)) >> (8U - (char)uVar7 & 0x1f))
                    != 0)) {
                  bVar13 = true;
                  goto LAB_00149c35;
                }
              }
            }
            bVar13 = false;
          }
          else {
            bVar13 = false;
            local_148[0] = 0;
            local_158[0] = 0;
            if (uVar4 < 0x21) {
              iVar3 = inet_pton(2,name,local_148);
              if ((iVar3 == 1) && (iVar3 = inet_pton(2,local_138,local_158), iVar3 == 1)) {
                if ((uVar4 & 0x1f) == 0) {
                  bVar13 = local_148[0] == local_158[0];
                }
                else {
                  uVar7 = local_158[0] ^ local_148[0];
                  bVar13 = (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                           uVar7 << 0x18) >> (-(char)uVar4 & 0x1fU) == 0;
                }
              }
              else {
LAB_00149c22:
                bVar13 = false;
              }
            }
          }
        }
      }
LAB_00149c35:
      if (!bVar13) goto LAB_00149c49;
      _Var11 = true;
      iVar3 = 1;
LAB_00149c76:
      bVar2 = false;
    }
  } while (iVar3 == 0);
  bVar13 = true;
  if (iVar3 != 3) {
    bVar13 = bVar2;
  }
LAB_00149cd7:
  if (bVar13) {
    return false;
  }
  return _Var11;
}

Assistant:

bool Curl_check_noproxy(const char *name, const char *no_proxy)
{
  char hostip[128];

  /*
   * If we do not have a hostname at all, like for example with a FILE
   * transfer, we have nothing to interrogate the noproxy list with.
   */
  if(!name || name[0] == '\0')
    return FALSE;

  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    const char *p = no_proxy;
    size_t namelen;
    enum nametype type = TYPE_HOST;
    if(!strcmp("*", no_proxy))
      return TRUE;

    /* NO_PROXY was specified and it was not just an asterisk */

    if(name[0] == '[') {
      char *endptr;
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
      if(namelen >= sizeof(hostip))
        return FALSE;
      memcpy(hostip, name, namelen);
      hostip[namelen] = 0;
      name = hostip;
      type = TYPE_IPV6;
    }
    else {
      unsigned int address;
      namelen = strlen(name);
      if(1 == Curl_inet_pton(AF_INET, name, &address))
        type = TYPE_IPV4;
      else {
        /* ignore trailing dots in the hostname */
        if(name[namelen - 1] == '.')
          namelen--;
      }
    }

    while(*p) {
      const char *token;
      size_t tokenlen = 0;
      bool match = FALSE;

      /* pass blanks */
      while(*p && ISBLANK(*p))
        p++;

      token = p;
      /* pass over the pattern */
      while(*p && !ISBLANK(*p) && (*p != ',')) {
        p++;
        tokenlen++;
      }

      if(tokenlen) {
        switch(type) {
        case TYPE_HOST:
          /* ignore trailing dots in the token to check */
          if(token[tokenlen - 1] == '.')
            tokenlen--;

          if(tokenlen && (*token == '.')) {
            /* ignore leading token dot as well */
            token++;
            tokenlen--;
          }
          /* A: example.com matches 'example.com'
             B: www.example.com matches 'example.com'
             C: nonexample.com DOES NOT match 'example.com'
          */
          if(tokenlen == namelen)
            /* case A, exact match */
            match = strncasecompare(token, name, namelen);
          else if(tokenlen < namelen) {
            /* case B, tailmatch domain */
            match = (name[namelen - tokenlen - 1] == '.') &&
              strncasecompare(token, name + (namelen - tokenlen),
                              tokenlen);
          }
          /* case C passes through, not a match */
          break;
        case TYPE_IPV4:
        case TYPE_IPV6: {
          const char *check = token;
          char *slash;
          unsigned int bits = 0;
          char checkip[128];
          if(tokenlen >= sizeof(checkip))
            /* this cannot match */
            break;
          /* copy the check name to a temp buffer */
          memcpy(checkip, check, tokenlen);
          checkip[tokenlen] = 0;
          check = checkip;

          slash = strchr(check, '/');
          /* if the slash is part of this token, use it */
          if(slash) {
            /* if the bits variable gets a crazy value here, that is fine as
               the value will then be rejected in the cidr function */
            bits = (unsigned int)atoi(slash + 1);
            *slash = 0; /* null terminate there */
          }
          if(type == TYPE_IPV6)
            match = Curl_cidr6_match(name, check, bits);
          else
            match = Curl_cidr4_match(name, check, bits);
          break;
        }
        }
        if(match)
          return TRUE;
      } /* if(tokenlen) */
      /* pass blanks after pattern */
      while(ISBLANK(*p))
        p++;
      /* if not a comma, this ends the loop */
      if(*p != ',')
        break;
      /* pass any number of commas */
      while(*p == ',')
        p++;
    } /* while(*p) */
  } /* NO_PROXY was specified and it was not just an asterisk */

  return FALSE;
}